

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnDataSegmentData
          (BinaryReaderObjdump *this,Index index,void *src_data,Address size)

{
  ObjdumpState *pOVar1;
  Offset OVar2;
  Offset OVar3;
  pointer pRVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  string_view sVar8;
  
  if ((((this->super_BinaryReaderObjdumpBase).options_)->mode == Details) &&
     (((this->super_BinaryReaderObjdumpBase).print_details_ & 1U) != 0)) {
    PrintDetails(this," - segment[%u]",index);
    sVar8 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->segment_names
                              ,index);
    if (sVar8._M_len != 0) {
      PrintDetails(this," <%.*s>",(ulong)(uint)sVar8._M_len,sVar8._M_str);
    }
    if ((this->data_flags_ & 1) == 0) {
      PrintDetails(this," memory=%u",(ulong)this->data_mem_index_);
    }
    else {
      PrintDetails(this," passive");
    }
    PrintDetails(this," size=%lu",size);
    if ((this->data_flags_ & 1) == 0) {
      PrintInitExpr(this,&this->current_init_expr_,true,true);
    }
    else {
      PrintDetails(this,"\n");
    }
    Stream::WriteMemoryDump
              (&((this->out_stream_)._M_t.
                 super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
                 super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream,
               src_data,size,this->data_offset_,Yes,"  - ",(char *)0x0);
    if (((this->super_BinaryReaderObjdumpBase).options_)->relocs == true) {
      pOVar1 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
      uVar6 = (ulong)this->next_data_reloc_;
      pRVar4 = (pOVar1->data_relocations).
               super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = ((long)(pOVar1->data_relocations).
                     super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pRVar4 >> 3) * -0x5555555555555555;
      if (uVar6 <= uVar7 && uVar7 - uVar6 != 0) {
        OVar2 = (this->super_BinaryReaderObjdumpBase).section_starts_[0xb];
        OVar3 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
                 super_BinaryReaderDelegate.state)->offset;
        do {
          if (((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
               super_BinaryReaderDelegate.state)->offset < pRVar4[uVar6].offset + OVar2) {
            return (Result)Ok;
          }
          BinaryReaderObjdumpBase::PrintRelocation
                    (&this->super_BinaryReaderObjdumpBase,pRVar4 + uVar6,
                     pRVar4[uVar6].offset + ((size + OVar2) - OVar3) + this->data_offset_);
          uVar5 = this->next_data_reloc_ + 1;
          uVar6 = (ulong)uVar5;
          this->next_data_reloc_ = uVar5;
          pOVar1 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
          pRVar4 = (pOVar1->data_relocations).
                   super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = ((long)(pOVar1->data_relocations).
                         super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pRVar4 >> 3) *
                  -0x5555555555555555;
        } while (uVar6 <= uVar7 && uVar7 - uVar6 != 0);
      }
    }
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnDataSegmentData(Index index,
                                              const void* src_data,
                                              Address size) {
  if (!ShouldPrintDetails()) {
    return Result::Ok;
  }

  PrintDetails(" - segment[%" PRIindex "]", index);
  auto name = GetSegmentName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  if (data_flags_ & SegPassive) {
    PrintDetails(" passive");
  } else {
    PrintDetails(" memory=%" PRIindex, data_mem_index_);
  }
  PrintDetails(" size=%" PRIaddress, size);
  if (data_flags_ & SegPassive) {
    PrintDetails("\n");
  } else {
    PrintInitExpr(current_init_expr_, /*as_unsigned=*/true);
  }

  out_stream_->WriteMemoryDump(src_data, size, data_offset_, PrintChars::Yes,
                               "  - ");

  // Print relocations from this segment.
  if (!options_->relocs) {
    return Result::Ok;
  }

  Offset data_start = GetSectionStart(BinarySection::Data);
  Offset segment_start = state->offset - size;
  Offset segment_offset = segment_start - data_start;
  while (next_data_reloc_ < objdump_state_->data_relocations.size()) {
    const Reloc& reloc = objdump_state_->data_relocations[next_data_reloc_];
    Offset abs_offset = data_start + reloc.offset;
    if (abs_offset > state->offset) {
      break;
    }
    PrintRelocation(reloc, reloc.offset - segment_offset + data_offset_);
    next_data_reloc_++;
  }

  return Result::Ok;
}